

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::String::padEnd(String *this,size_t n,char c)

{
  Error EVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(byte)*this;
  if (0x1e < uVar2) {
    uVar2 = *(ulong *)(this + 8);
  }
  if (uVar2 <= n && n - uVar2 != 0) {
    EVar1 = _opChars(this,kAppend,c,n - uVar2);
    return EVar1;
  }
  return 0;
}

Assistant:

Error String::padEnd(size_t n, char c) noexcept {
  size_t size = this->size();
  return n > size ? appendChars(c, n - size) : kErrorOk;
}